

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O0

void h265e_dpb_free_unsed(H265eDpb *dpb,EncCpbStatus *cpb)

{
  MPP_RET MVar1;
  H265eDpbFrm *pHVar2;
  H265eDpbFrm *frm_1;
  H265eDpbFrm *frm;
  RK_S32 i;
  EncCpbStatus *cpb_local;
  H265eDpb *dpb_local;
  
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_dpb","enter\n","h265e_dpb_free_unsed");
  }
  if ((((cpb->curr).val >> 6 & 1) != 0) &&
     (pHVar2 = h265e_find_cpb_frame(dpb->frame_list,0x10,&cpb->curr), pHVar2 != (H265eDpbFrm *)0x0))
  {
    if ((h265e_debug & 0x80) != 0) {
      _mpp_log_l(4,"h265e_dpb","free curr unreference buf poc %d",(char *)0x0,
                 (ulong)(uint)pHVar2->slice->poc);
    }
    pHVar2->is_long_term = 0;
    pHVar2->used_by_cur = 0;
    *(ushort *)&pHVar2->field_7 = *(ushort *)&pHVar2->field_7 & 0xff00;
    pHVar2->slice->is_referenced = 0;
  }
  for (frm._4_4_ = 0; frm._4_4_ < 0x11; frm._4_4_ = frm._4_4_ + 1) {
    pHVar2 = dpb->frame_list + frm._4_4_;
    if (((((uint)pHVar2->field_7 & 0xff) != 0) &&
        (MVar1 = h265e_check_frame_cpb(pHVar2,0x10,cpb->final), MVar1 != MPP_OK)) &&
       (MVar1 = h265e_pskip_ref_check(dpb,cpb,pHVar2), MVar1 == MPP_OK)) {
      if ((h265e_debug & 0x80) != 0) {
        _mpp_log_l(4,"h265e_dpb","cpb final unreference buf poc %d",(char *)0x0,
                   (ulong)(uint)pHVar2->slice->poc);
      }
      pHVar2->is_long_term = 0;
      pHVar2->used_by_cur = 0;
      *(ushort *)&pHVar2->field_7 = *(ushort *)&pHVar2->field_7 & 0xff00;
      pHVar2->slice->is_referenced = 0;
    }
  }
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_dpb","leave\n","h265e_dpb_free_unsed");
  }
  return;
}

Assistant:

void h265e_dpb_free_unsed(H265eDpb *dpb, EncCpbStatus *cpb)
{
    RK_S32 i = 0;

    h265e_dbg_func("enter\n");

    if (cpb->curr.is_non_ref) {
        H265eDpbFrm *frm = h265e_find_cpb_frame(dpb->frame_list, MAX_REFS, &cpb->curr);
        if (frm) {
            h265e_dbg_dpb("free curr unreference buf poc %d", frm->slice->poc);
            frm->is_long_term = 0;
            frm->used_by_cur = 0;
            frm->dpb_used = 0;
            frm->slice->is_referenced = 0;
        }
    }

    for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dpb->frame_list); i++) {
        H265eDpbFrm *frm = &dpb->frame_list[i];
        if (!frm->dpb_used)
            continue;
        if (h265e_check_frame_cpb(frm, MAX_REFS, &cpb->final[0])) {
            if (!h265e_pskip_ref_check(dpb, cpb, frm)) {
                h265e_dbg_dpb("cpb final unreference buf poc %d", frm->slice->poc);
                frm->is_long_term = 0;
                frm->used_by_cur = 0;
                frm->dpb_used = 0;
                frm->slice->is_referenced = 0;
            }
        }
    }

    h265e_dbg_func("leave\n");
}